

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform * pbrt::Translate(Vector3f *delta)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  undefined8 uVar4;
  Float (*paFVar5) [4];
  Transform *in_RDI;
  
  FVar1 = (delta->super_Tuple3<pbrt::Vector3,_float>).x;
  FVar2 = (delta->super_Tuple3<pbrt::Vector3,_float>).y;
  FVar3 = (delta->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar4 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  *(undefined8 *)(in_RDI->m).m[0] = uVar4;
  (in_RDI->m).m[0][2] = 0.0;
  (in_RDI->m).m[0][3] = FVar1;
  *(Float *)((long)((in_RDI->m).m + 1) + 0) = 0.0;
  *(Float *)((long)((in_RDI->m).m + 1) + 4) = 1.0;
  (in_RDI->m).m[1][2] = 0.0;
  (in_RDI->m).m[1][3] = FVar2;
  *(Float *)((long)((in_RDI->m).m + 2) + 0) = 0.0;
  *(Float *)((long)((in_RDI->m).m + 2) + 4) = 0.0;
  (in_RDI->m).m[2][2] = 1.0;
  (in_RDI->m).m[2][3] = FVar3;
  *(Float *)((long)((in_RDI->m).m + 3) + 0) = 0.0;
  *(Float *)((long)((in_RDI->m).m + 3) + 4) = 0.0;
  paFVar5 = (in_RDI->m).m;
  *(Float *)((long)(paFVar5 + 3) + 8) = 0.0;
  *(Float *)((long)(paFVar5 + 3) + 0xc) = 1.0;
  uVar4 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  *(undefined8 *)(in_RDI->mInv).m[0] = uVar4;
  (in_RDI->mInv).m[0][2] = 0.0;
  (in_RDI->mInv).m[0][3] = -FVar1;
  *(Float *)((long)((in_RDI->mInv).m + 1) + 0) = 0.0;
  *(Float *)((long)((in_RDI->mInv).m + 1) + 4) = 1.0;
  (in_RDI->mInv).m[1][2] = 0.0;
  (in_RDI->mInv).m[1][3] = -FVar2;
  *(Float *)((long)((in_RDI->mInv).m + 2) + 0) = 0.0;
  *(Float *)((long)((in_RDI->mInv).m + 2) + 4) = 0.0;
  (in_RDI->mInv).m[2][2] = 1.0;
  (in_RDI->mInv).m[2][3] = -FVar3;
  *(Float *)((long)((in_RDI->mInv).m + 3) + 0) = 0.0;
  *(Float *)((long)((in_RDI->mInv).m + 3) + 4) = 0.0;
  paFVar5 = (in_RDI->mInv).m;
  *(Float *)((long)(paFVar5 + 3) + 8) = 0.0;
  *(Float *)((long)(paFVar5 + 3) + 0xc) = 1.0;
  return in_RDI;
}

Assistant:

Transform Translate(const Vector3f &delta) {
    SquareMatrix<4> m(1, 0, 0, delta.x,
                      0, 1, 0, delta.y,
                      0, 0, 1, delta.z,
                      0, 0, 0, 1);
    SquareMatrix<4> minv(1, 0, 0, -delta.x,
                         0, 1, 0, -delta.y,
                         0, 0, 1, -delta.z,
                         0, 0, 0, 1);
    return Transform(m, minv);
}